

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::SerializeWithCachedSizesToArray
          (ExtensionSet *this,int start_field_number,int end_field_number,uint8 *target)

{
  bool bVar1;
  bool bVar2;
  pointer ppVar3;
  pointer ppVar4;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  local_28;
  const_iterator iter;
  uint8 *target_local;
  int end_field_number_local;
  int start_field_number_local;
  ExtensionSet *this_local;
  
  iter._M_node = (_Base_ptr)target;
  target_local._0_4_ = end_field_number;
  target_local._4_4_ = start_field_number;
  _end_field_number_local = this;
  std::
  _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  ::_Rb_tree_const_iterator(&local_28);
  local_30 = (_Base_ptr)
             std::
             map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
             ::lower_bound(&this->extensions_,(key_type *)((long)&target_local + 4));
  local_28._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
         ::end(&this->extensions_);
    bVar2 = std::operator!=(&local_28,&local_38);
    bVar1 = false;
    if (bVar2) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
               ::operator->(&local_28);
      bVar1 = ppVar3->first < (int)target_local;
    }
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_28);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_28);
    iter._M_node = (_Base_ptr)
                   Extension::SerializeFieldWithCachedSizesToArray
                             (&ppVar3->second,ppVar4->first,iter._M_node);
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
    ::operator++(&local_28);
  }
  return (uint8 *)iter._M_node;
}

Assistant:

uint8* ExtensionSet::SerializeWithCachedSizesToArray(
    int start_field_number, int end_field_number,
    uint8* target) const {
  map<int, Extension>::const_iterator iter;
  for (iter = extensions_.lower_bound(start_field_number);
       iter != extensions_.end() && iter->first < end_field_number;
       ++iter) {
    target = iter->second.SerializeFieldWithCachedSizesToArray(iter->first,
                                                               target);
  }
  return target;
}